

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::CampaignManager::Record
          (CampaignManager *this,string *name,size_t step,double time)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  iterator iVar4;
  long lVar5;
  CampaignRecord r;
  double local_78;
  size_t local_70;
  CampaignRecord local_68;
  
  local_78 = time;
  local_70 = step;
  if (0 < (this->m_Options).verbose) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Campaign Manager ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_WriterRank);
    poVar3 = std::operator<<(poVar3,"   Record name = ");
    poVar3 = std::operator<<(poVar3,(string *)name);
    poVar3 = std::operator<<(poVar3," step = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," time = ");
    poVar3 = std::ostream::_M_insert<double>(time);
    std::operator<<(poVar3,"\n");
  }
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->cmap)._M_h,name);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
      ._M_cur == (__node_type *)0x0) {
    CampaignRecord::CampaignRecord(&local_68,step,time);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,adios2::core::engine::CampaignRecord&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->cmap,name,&local_68);
    CampaignRecord::~CampaignRecord(&local_68);
  }
  else {
    lVar2 = *(long *)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                            ._M_cur + 0x30);
    lVar5 = step - *(long *)(lVar2 + -8);
    if (lVar2 - *(long *)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                                ._M_cur + 0x28) == 8) {
      dVar1 = *(double *)
               (*(long *)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                                ._M_cur + 0x50) + -8);
      *(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                      ._M_cur + 0x40) = lVar5;
      *(double *)
       ((long)iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x60) = time - dVar1;
    }
    else if (*(long *)(lVar2 + -8) - *(long *)(lVar2 + -0x10) != lVar5) {
      *(undefined8 *)
       ((long)iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x40) = 0;
      *(undefined8 *)
       ((long)iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x60) = 0;
      *(undefined1 *)
       ((long)iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x68) = 1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                      ._M_cur + 0x28),&local_70);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                      ._M_cur + 0x48),&local_78);
  }
  return;
}

Assistant:

void CampaignManager::Record(const std::string &name, const size_t step, const double time)
{
    if (m_Options.verbose > 0)
    {
        std::cout << "Campaign Manager " << m_WriterRank << "   Record name = " << name
                  << " step = " << step << " time = " << time << "\n";
    }
    auto r = cmap.find(name);
    if (r != cmap.end())
    {
        // update record
        size_t last_step = r->second.steps.back();
        size_t delta_step = step - last_step;
        double last_time = r->second.times.back();
        double delta_time = time - last_time;
        auto nsteps = r->second.steps.size();
        if (nsteps == 1)
        {
            r->second.delta_step = delta_step;
            r->second.delta_time = delta_time;
        }
        else
        {
            size_t old_delta_step = r->second.steps.back() - r->second.steps.rbegin()[1];
            if (old_delta_step != delta_step)
            {
                r->second.delta_step = 0;
                r->second.delta_time = 0.0;
                r->second.varying_deltas = true;
            }
        }
        r->second.steps.push_back(step);
        r->second.times.push_back(time);
    }
    else
    {
        // new entry
        CampaignRecord r(step, time);
        cmap.emplace(name, r);
    }
}